

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  TAttributes attributes;
  TAttributes local_38;
  
  *statement = (TIntermNode *)0x0;
  local_38.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
  local_38.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       &local_38.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node.super__List_node_base;
  local_38.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = 0;
  local_38.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       local_38.
       super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  acceptAttributes(this,&local_38);
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  switch(EVar2) {
  case EHTokFor:
  case EHTokDo:
  case EHTokWhile:
    bVar1 = acceptIterationStatement(this,statement,&local_38);
    break;
  case EHTokBreak:
  case EHTokContinue:
  case EHTokDiscard:
  case EHTokReturn:
    bVar1 = acceptJumpStatement(this,statement);
    break;
  case EHTokIf:
    bVar1 = acceptSelectionStatement(this,statement,&local_38);
    break;
  case EHTokSwitch:
    bVar1 = acceptSwitchStatement(this,statement,&local_38);
    break;
  case EHTokCase:
    bVar1 = acceptCaseLabel(this,statement);
    break;
  case EHTokDefault:
    bVar1 = acceptDefaultLabel(this,statement);
    break;
  default:
    if (EVar2 == EHTokRightBrace) {
      return false;
    }
    if (EVar2 == EHTokLeftBrace) {
      bVar1 = acceptScopedCompoundStatement(this,statement);
      return bVar1;
    }
  case EHTokElse:
    bVar1 = acceptSimpleStatement(this,statement);
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptStatement(TIntermNode*& statement)
{
    statement = nullptr;

    // attributes
    TAttributes attributes;
    acceptAttributes(attributes);

    // attributed_statement
    switch (peek()) {
    case EHTokLeftBrace:
        return acceptScopedCompoundStatement(statement);

    case EHTokIf:
        return acceptSelectionStatement(statement, attributes);

    case EHTokSwitch:
        return acceptSwitchStatement(statement, attributes);

    case EHTokFor:
    case EHTokDo:
    case EHTokWhile:
        return acceptIterationStatement(statement, attributes);

    case EHTokContinue:
    case EHTokBreak:
    case EHTokDiscard:
    case EHTokReturn:
        return acceptJumpStatement(statement);

    case EHTokCase:
        return acceptCaseLabel(statement);
    case EHTokDefault:
        return acceptDefaultLabel(statement);

    case EHTokRightBrace:
        // Performance: not strictly necessary, but stops a bunch of hunting early,
        // and is how sequences of statements end.
        return false;

    default:
        return acceptSimpleStatement(statement);
    }

    return true;
}